

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O1

void proto3_arena_unittest::NestedTestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  Nonnull<const_char_*> pcVar6;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_00d2a309;
  if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
               google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::NestedTestAllTypes>);
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) == 0) goto LAB_00d2a292;
  if ((uVar1 & 1) == 0) {
LAB_00d2a234:
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00d2a2f5;
      to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::TestAllTypes>
                           (arena,pMVar2);
        to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
      }
      else {
        TestAllTypes::MergeImpl(to_msg_00,pMVar2);
      }
    }
    if ((uVar1 & 4) == 0) {
LAB_00d2a292:
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
      uVar3 = (from_msg->_internal_metadata_).ptr_;
      if ((uVar3 & 1) == 0) {
        return;
      }
      google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
                (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8))
      ;
      return;
    }
    pMVar2 = (MessageLite *)from_msg[4]._vptr_MessageLite;
    if (pMVar2 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[4]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::TestAllTypes>
                            (arena,pMVar2);
        to_msg[4]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestAllTypes::MergeImpl((MessageLite *)to_msg[4]._vptr_MessageLite,pMVar2);
      }
      goto LAB_00d2a292;
    }
  }
  else {
    pMVar2 = (MessageLite *)from_msg[3]._vptr_MessageLite;
    if (pMVar2 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::NestedTestAllTypes>
                            (arena,pMVar2);
        to_msg[3]._vptr_MessageLite = pp_Var5;
      }
      else {
        MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar2);
      }
      goto LAB_00d2a234;
    }
    MergeImpl((NestedTestAllTypes *)&stack0xffffffffffffffd0);
LAB_00d2a2f5:
    MergeImpl((NestedTestAllTypes *)&stack0xffffffffffffffd0);
  }
  MergeImpl((NestedTestAllTypes *)&stack0xffffffffffffffd0);
LAB_00d2a309:
  MergeImpl();
}

Assistant:

void NestedTestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<NestedTestAllTypes*>(&to_msg);
  auto& from = static_cast<const NestedTestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.NestedTestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_child()->MergeFrom(
      from._internal_repeated_child());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.payload_ != nullptr);
      if (_this->_impl_.payload_ == nullptr) {
        _this->_impl_.payload_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.payload_);
      } else {
        _this->_impl_.payload_->MergeFrom(*from._impl_.payload_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.lazy_payload_ != nullptr);
      if (_this->_impl_.lazy_payload_ == nullptr) {
        _this->_impl_.lazy_payload_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lazy_payload_);
      } else {
        _this->_impl_.lazy_payload_->MergeFrom(*from._impl_.lazy_payload_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}